

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

Type __thiscall ON_SubDComponentPtr::ComponentType(ON_SubDComponentPtr *this)

{
  uint uVar1;
  ON_SubDComponentPtr *this_local;
  
  uVar1 = (uint)this->m_ptr & 6;
  if (uVar1 == 2) {
    this_local._7_1_ = Vertex;
  }
  else if (uVar1 == 4) {
    this_local._7_1_ = Edge;
  }
  else if (uVar1 == 6) {
    this_local._7_1_ = Face;
  }
  else {
    this_local._7_1_ = Unset;
  }
  return this_local._7_1_;
}

Assistant:

ON_SubDComponentPtr::Type ON_SubDComponentPtr::ComponentType() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
    return ON_SubDComponentPtr::Type::Vertex;
  case ON_SUBD_COMPONENT_TYPE_EDGE:
    return ON_SubDComponentPtr::Type::Edge;
  case ON_SUBD_COMPONENT_TYPE_FACE:
    return ON_SubDComponentPtr::Type::Face;
  }
  return ON_SubDComponentPtr::Type::Unset;
}